

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *other)

{
  long lVar1;
  long lVar2;
  size_type new_capacity;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->_union).indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&this->_union + 8) = 0;
  this->_size = 0;
  uVar3 = other->_size;
  new_capacity = uVar3 - 0x11;
  if (uVar3 < 0x11) {
    new_capacity = uVar3;
  }
  change_capacity(this,new_capacity);
  uVar3 = new_capacity + this->_size;
  this->_size = uVar3;
  if (0x10 < uVar3) {
    this = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
           (this->_union).indirect_contents.indirect;
  }
  uVar3 = other->_size;
  if (0x10 < uVar3) {
    other = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
            (other->_union).indirect_contents.indirect;
    uVar3 = uVar3 - 0x11;
  }
  for (lVar2 = 0; (int)uVar3 != lVar2; lVar2 = lVar2 + 1) {
    (this->_union).direct[lVar2] = (other->_union).direct[lVar2];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

prevector(const prevector<N, T, Size, Diff>& other) {
        size_type n = other.size();
        change_capacity(n);
        _size += n;
        fill(item_ptr(0), other.begin(),  other.end());
    }